

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

void __thiscall cmStateSnapshot::SetDirectoryDefinitions(cmStateSnapshot *this)

{
  string_view value;
  string *psVar1;
  allocator<char> local_e9;
  string local_e8;
  string_view local_c8;
  allocator<char> local_b1;
  string local_b0;
  string_view local_90;
  allocator<char> local_79;
  string local_78;
  string_view local_58;
  allocator<char> local_31;
  string local_30;
  cmStateSnapshot *local_10;
  cmStateSnapshot *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_SOURCE_DIR",&local_31);
  psVar1 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  local_58 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar1)
  ;
  SetDefinition(this,&local_30,local_58);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CMAKE_CURRENT_SOURCE_DIR",&local_79);
  psVar1 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  local_90 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar1)
  ;
  SetDefinition(this,&local_78,local_90);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"CMAKE_BINARY_DIR",&local_b1);
  psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  local_c8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar1)
  ;
  SetDefinition(this,&local_b0,local_c8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"CMAKE_CURRENT_BINARY_DIR",&local_e9);
  psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar1);
  SetDefinition(this,&local_e8,value);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  return;
}

Assistant:

void cmStateSnapshot::SetDirectoryDefinitions()
{
  this->SetDefinition("CMAKE_SOURCE_DIR", this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR",
                      this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR", this->State->GetBinaryDirectory());
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR",
                      this->State->GetBinaryDirectory());
}